

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdReplace<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,unsigned_long>
          (Thread *this,Instr instr)

{
  Simd<unsigned_long,_(unsigned_char)__x02_> value;
  Simd<unsigned_long,_(unsigned_char)__x02_> simd;
  unsigned_long val;
  Thread *this_local;
  
  simd.v[1] = Pop<unsigned_long>(this);
  value = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  simd.v[(ulong)instr.field_2.imm_u8 - 1] = simd.v[1];
  Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd.v[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}